

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_client.cpp
# Opt level: O2

void ConnectFunc(Handle *handle,uint32_t err)

{
  element_type *peVar1;
  ostream *poVar2;
  uint16_t port;
  string msg;
  string ip;
  ushort local_52;
  undefined8 local_50;
  uint local_48;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  if (err != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout," [ConnectFunc] some thing error : ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_CNSocket[4])(peVar1,&local_30,&local_52);
  poVar2 = std::operator<<((ostream *)&std::cout," [ConnectFunc] : ip : ");
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  poVar2 = std::operator<<(poVar2,"port : ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_52);
  std::endl<char,std::char_traits<char>>(poVar2);
  GetMsg_abi_cxx11_();
  peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_CNSocket[5])(peVar1,local_50,(ulong)local_48);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ConnectFunc(Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        std::string ip;
        uint16_t port;
        handle->GetAddress(ip, port);
        std::cout << " [ConnectFunc] : ip : " << ip << "port : " << port << std::endl;
        auto msg = GetMsg();
        handle->Write(msg.c_str(), (uint32_t)msg.length());

    } else {
        std::cout << " [ConnectFunc] some thing error : " << err << std::endl;
    }
}